

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error TT_Process_Composite_Component
                   (TT_Loader loader,FT_SubGlyph subglyph,FT_UInt start_point,
                   FT_UInt num_base_points)

{
  ushort uVar1;
  int a;
  int a_00;
  uint uVar2;
  uint uVar3;
  FT_Int32 FVar4;
  long *plVar5;
  long *plVar6;
  FT_Fixed FVar7;
  FT_Fixed FVar8;
  TT_Driver driver;
  TT_Face face;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_Fixed mac_yscale;
  FT_Fixed mac_xscale;
  FT_Vector *p2;
  FT_Vector *p1;
  FT_UInt l;
  FT_UInt k;
  FT_UInt num_points;
  FT_Pos y;
  FT_Pos x;
  undefined1 local_58 [7];
  FT_Bool have_scale;
  FT_Outline current;
  FT_GlyphLoader gloader;
  FT_UInt num_base_points_local;
  FT_UInt start_point_local;
  FT_SubGlyph subglyph_local;
  TT_Loader loader_local;
  
  current._32_8_ = loader->gloader;
  current._0_8_ = (((FT_GlyphLoader)current._32_8_)->base).outline.points + num_base_points;
  local_58._2_2_ =
       (((FT_GlyphLoader)current._32_8_)->base).outline.n_points - (short)num_base_points;
  uVar1 = subglyph->flags;
  if ((uVar1 & 200) != 0) {
    FT_Outline_Transform((FT_Outline *)local_58,&subglyph->transform);
  }
  if ((subglyph->flags & 2) == 0) {
    uVar2 = start_point + subglyph->arg1;
    uVar3 = num_base_points + subglyph->arg2;
    if ((num_base_points <= uVar2) || ((uint)(int)*(short *)(current._32_8_ + 0x1a) <= uVar3)) {
      return 0x15;
    }
    plVar5 = (long *)(*(long *)(current._32_8_ + 0x20) + (ulong)uVar2 * 0x10);
    plVar6 = (long *)(*(long *)(current._32_8_ + 0x20) + (ulong)uVar3 * 0x10);
    y = *plVar5 - *plVar6;
    _k = plVar5[1] - plVar6[1];
  }
  else {
    a = subglyph->arg1;
    y = (FT_Pos)a;
    a_00 = subglyph->arg2;
    _k = (ulong)a_00;
    if ((y == 0) && (_k == 0)) {
      return 0;
    }
    if (((uVar1 & 200) != 0) && ((subglyph->flags & 0x800) != 0)) {
      FVar7 = FT_Hypot((subglyph->transform).xx,(subglyph->transform).xy);
      FVar8 = FT_Hypot((subglyph->transform).yy,(subglyph->transform).yx);
      FVar4 = FT_MulFix_x86_64(a,(FT_Int32)FVar7);
      y = (FT_Pos)FVar4;
      FVar4 = FT_MulFix_x86_64(a_00,(FT_Int32)FVar8);
      _k = (ulong)FVar4;
    }
    if ((loader->load_flags & 1) == 0) {
      FVar7 = loader->size->metrics->y_scale;
      FVar4 = FT_MulFix_x86_64((FT_Int32)y,(FT_Int32)loader->size->metrics->x_scale);
      y = (FT_Pos)FVar4;
      FVar4 = FT_MulFix_x86_64((FT_Int32)_k,(FT_Int32)FVar7);
      _k = (ulong)FVar4;
      if (((subglyph->flags & 4) != 0) && ((loader->load_flags & 2) == 0)) {
        if (*(int *)&(loader->face->root).driver[2].root.library == 0x23) {
          y = y + 0x20U & 0xffffffffffffffc0;
        }
        _k = _k + 0x20 & 0xffffffffffffffc0;
      }
    }
  }
  if ((y != 0) || (_k != 0)) {
    FT_Outline_Translate((FT_Outline *)local_58,y,_k);
  }
  return 0;
}

Assistant:

static FT_Error
  TT_Process_Composite_Component( TT_Loader    loader,
                                  FT_SubGlyph  subglyph,
                                  FT_UInt      start_point,
                                  FT_UInt      num_base_points )
  {
    FT_GlyphLoader  gloader = loader->gloader;
    FT_Outline      current;
    FT_Bool         have_scale;
    FT_Pos          x, y;


    current.points   = gloader->base.outline.points +
                         num_base_points;
    current.n_points = gloader->base.outline.n_points -
                         (short)num_base_points;

    have_scale = FT_BOOL( subglyph->flags & ( WE_HAVE_A_SCALE     |
                                              WE_HAVE_AN_XY_SCALE |
                                              WE_HAVE_A_2X2       ) );

    /* perform the transform required for this subglyph */
    if ( have_scale )
      FT_Outline_Transform( &current, &subglyph->transform );

    /* get offset */
    if ( !( subglyph->flags & ARGS_ARE_XY_VALUES ) )
    {
      FT_UInt     num_points = (FT_UInt)gloader->base.outline.n_points;
      FT_UInt     k = (FT_UInt)subglyph->arg1;
      FT_UInt     l = (FT_UInt)subglyph->arg2;
      FT_Vector*  p1;
      FT_Vector*  p2;


      /* match l-th point of the newly loaded component to the k-th point */
      /* of the previously loaded components.                             */

      /* change to the point numbers used by our outline */
      k += start_point;
      l += num_base_points;
      if ( k >= num_base_points ||
           l >= num_points      )
        return FT_THROW( Invalid_Composite );

      p1 = gloader->base.outline.points + k;
      p2 = gloader->base.outline.points + l;

      x = p1->x - p2->x;
      y = p1->y - p2->y;
    }
    else
    {
      x = subglyph->arg1;
      y = subglyph->arg2;

      if ( !x && !y )
        return FT_Err_Ok;

      /* Use a default value dependent on                                  */
      /* TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED.  This is useful for old */
      /* TT fonts which don't set the xxx_COMPONENT_OFFSET bit.            */

      if ( have_scale &&
#ifdef TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED
           !( subglyph->flags & UNSCALED_COMPONENT_OFFSET ) )
#else
            ( subglyph->flags & SCALED_COMPONENT_OFFSET ) )
#endif
      {

#if 0

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is what Apple documents.  But it doesn't work.   */
        /*                                                                 */
        int  a = subglyph->transform.xx > 0 ?  subglyph->transform.xx
                                            : -subglyph->transform.xx;
        int  b = subglyph->transform.yx > 0 ?  subglyph->transform.yx
                                            : -subglyph->transform.yx;
        int  c = subglyph->transform.xy > 0 ?  subglyph->transform.xy
                                            : -subglyph->transform.xy;
        int  d = subglyph->transform.yy > 0 ?  subglyph->transform.yy
                                            : -subglyph->transform.yy;
        int  m = a > b ? a : b;
        int  n = c > d ? c : d;


        if ( a - b <= 33 && a - b >= -33 )
          m *= 2;
        if ( c - d <= 33 && c - d >= -33 )
          n *= 2;
        x = FT_MulFix( x, m );
        y = FT_MulFix( y, n );

#else /* 1 */

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is a guess and works much better than the above. */
        /*                                                                 */
        FT_Fixed  mac_xscale = FT_Hypot( subglyph->transform.xx,
                                         subglyph->transform.xy );
        FT_Fixed  mac_yscale = FT_Hypot( subglyph->transform.yy,
                                         subglyph->transform.yx );


        x = FT_MulFix( x, mac_xscale );
        y = FT_MulFix( y, mac_yscale );

#endif /* 1 */

      }

      if ( !( loader->load_flags & FT_LOAD_NO_SCALE ) )
      {
        FT_Fixed  x_scale = loader->size->metrics->x_scale;
        FT_Fixed  y_scale = loader->size->metrics->y_scale;


        x = FT_MulFix( x, x_scale );
        y = FT_MulFix( y, y_scale );

        if ( subglyph->flags & ROUND_XY_TO_GRID )
        {
          TT_Face    face   = loader->face;
          TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );


          if ( IS_HINTED( loader->load_flags ) )
          {
            /*
             * We round the horizontal offset only if there is hinting along
             * the x axis; this corresponds to integer advance width values.
             *
             * Theoretically, a glyph's bytecode can toggle ClearType's
             * `backward compatibility' mode, which would allow modification
             * of the advance width.  In reality, however, applications
             * neither allow nor expect modified advance widths if sub-pixel
             * rendering is active.
             *
             */
            if ( driver->interpreter_version == TT_INTERPRETER_VERSION_35 )
              x = FT_PIX_ROUND( x );

            y = FT_PIX_ROUND( y );
          }
        }
      }
    }

    if ( x || y )
      FT_Outline_Translate( &current, x, y );

    return FT_Err_Ok;
  }